

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::parse_declare_keyword(Parser *this)

{
  Type TVar1;
  pointer pTVar2;
  Token *pTVar3;
  pointer pTVar4;
  AbstractSyntaxNode *pAVar5;
  ostream *poVar6;
  parser_exception *this_00;
  int iVar7;
  stringstream buffer;
  string local_2e8;
  TokenPosition local_2c8;
  Token local_2b0;
  Token local_258;
  Token local_200;
  Type local_1a8 [4];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  local_1a8[0] = kDeclareKeyword;
  pAVar5 = AbstractSyntaxNode::add_child
                     (this->current_,local_1a8,
                      (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + this->index_ % this->total_);
  this->current_ = pAVar5;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  iVar7 = this->index_ % this->total_;
  pTVar2 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = pTVar2 + iVar7;
  TVar1 = pTVar2[iVar7].type_;
  if (TVar1 == kVoid) {
    local_2e8._M_dataplus._M_p._0_4_ = 8;
    AbstractSyntaxNode::add_child(this->current_,(Type *)&local_2e8,pTVar3);
    local_2e8._M_dataplus._M_p._0_4_ = 8;
    match(&local_2b0,this,(Type *)&local_2e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2b0.extra_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.content_._M_dataplus._M_p != &local_2b0.content_.field_2) {
      operator_delete(local_2b0.content_._M_dataplus._M_p);
    }
  }
  else {
    if (TVar1 == kReal) {
      local_2e8._M_dataplus._M_p._0_4_ = 7;
      AbstractSyntaxNode::add_child(this->current_,(Type *)&local_2e8,pTVar3);
      local_2e8._M_dataplus._M_p._0_4_ = 7;
      match(&local_258,this,(Type *)&local_2e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_258.extra_);
      pTVar3 = &local_258;
      local_200.content_._M_dataplus._M_p = local_258.content_._M_dataplus._M_p;
    }
    else {
      if (TVar1 != kInt) {
        std::__ostream_insert<char,std::char_traits<char>>(local_198,anon_var_dwarf_985ac,0x14);
        Token::content_abi_cxx11_
                  (&local_2e8,
                   (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                   super__Vector_impl_data._M_start + this->index_ % this->total_);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_198,
                            (char *)CONCAT44(local_2e8._M_dataplus._M_p._4_4_,
                                             local_2e8._M_dataplus._M_p._0_4_),
                            local_2e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,anon_var_dwarf_98604,0x2d);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_2e8._M_dataplus._M_p._4_4_,local_2e8._M_dataplus._M_p._0_4_) !=
            &local_2e8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_2e8._M_dataplus._M_p._4_4_,local_2e8._M_dataplus._M_p._0_4_
                                  ));
        }
        this_00 = (parser_exception *)__cxa_allocate_exception(0x40);
        iVar7 = this->index_ % this->total_;
        pTVar2 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar4 = pTVar2 + iVar7;
        local_2c8.super_Position.row_ = (pTVar4->position_).super_Position.row_;
        local_2c8.super_Position.col_ = (pTVar4->position_).super_Position.col_;
        local_2c8.super_Position._vptr_Position = (_func_int **)&PTR_clear_001539d0;
        local_2c8.length_ = pTVar2[iVar7].position_.length_;
        std::__cxx11::stringbuf::str();
        parser_exception::parser_exception(this_00,&local_2c8,&local_2e8);
        __cxa_throw(this_00,&parser_exception::typeinfo,parser_exception::~parser_exception);
      }
      local_2e8._M_dataplus._M_p._0_4_ = 6;
      AbstractSyntaxNode::add_child(this->current_,(Type *)&local_2e8,pTVar3);
      local_2e8._M_dataplus._M_p._0_4_ = 6;
      match(&local_200,this,(Type *)&local_2e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_200.extra_);
      pTVar3 = &local_200;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.content_._M_dataplus._M_p != &(pTVar3->content_).field_2) {
      operator_delete(local_200.content_._M_dataplus._M_p);
    }
    if ((this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
        super__Vector_impl_data._M_start[this->index_ % this->total_].type_ == kLeftBracket) {
      parse_array(this);
    }
  }
  this->current_ = this->current_->parent_;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void Parser::parse_declare_keyword() {
    current_ = current_->add_child(Token::Type::kDeclareKeyword, forward_token());
    std::stringstream buffer;

    if (forward_token().type() == Token::Type::kInt) {
        current_->add_child(Token::Type::kInt, forward_token());
        match(Token::Type::kInt);
        if (forward_token().type() == Token::Type::kLeftBracket) {
            parse_array();
        }
    } else if (forward_token().type() == Token::Type::kReal) {
        current_->add_child(Token::Type::kReal, forward_token());
        match(Token::Type::kReal);
        if (forward_token().type() == Token::Type::kLeftBracket) {
            parse_array();
        }
    } else if (forward_token().type() == Token::Type::kVoid) {
        current_->add_child(Token::Type::kVoid, forward_token());
        match(Token::Type::kVoid);
    } else {
        buffer << "无效的标识符 \"" << forward_token().content() << "\", 定义关键字仅允许 int / real / void";
        throw parser_exception(forward_token().position(), buffer.str());
    }

    current_ = current_->parent();
}